

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O2

XMLCh * __thiscall
PSVIWriterHandlers::translateValidity(PSVIWriterHandlers *this,VALIDITY_STATE validity)

{
  if (validity < (VALIDITY_VALID|VALIDITY_INVALID)) {
    return (XMLCh *)(&PTR_fgNotKnown_0011d1d0)[validity];
  }
  return (XMLCh *)&xercesc_4_0::PSVIUni::fgUnknown;
}

Assistant:

const XMLCh* PSVIWriterHandlers::translateValidity(PSVIItem::VALIDITY_STATE validity) {
	switch (validity) {
		case PSVIItem::VALIDITY_NOTKNOWN :
			return PSVIUni::fgNotKnown;
		case PSVIItem::VALIDITY_VALID :
			return PSVIUni::fgValid;
		case PSVIItem::VALIDITY_INVALID :
			return PSVIUni::fgInvalid;
		default :
			return PSVIUni::fgUnknown;
	}
}